

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_append_text_runes(nk_str *str,nk_rune *text,int len)

{
  int len_00;
  int in_EDX;
  nk_str *in_RSI;
  long in_RDI;
  nk_glyph glyph;
  int byte_len;
  int i;
  int iVar1;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == (nk_str *)0x0)) || (in_EDX == 0)) {
    local_4 = 0;
  }
  else {
    iVar1 = 0;
    while ((local_4 = in_EDX, iVar1 < in_EDX &&
           (len_00 = nk_utf_encode((nk_rune)in_RDI,(char *)in_RSI,in_EDX), local_4 = in_EDX,
           len_00 != 0))) {
      nk_str_append_text_char(in_RSI,(char *)CONCAT44(in_EDX,iVar1),len_00);
      iVar1 = iVar1 + 1;
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_str_append_text_runes(struct nk_str *str, const nk_rune *text, int len)
{
int i = 0;
int byte_len = 0;
nk_glyph glyph;

NK_ASSERT(str);
if (!str || !text || !len) return 0;
for (i = 0; i < len; ++i) {
byte_len = nk_utf_encode(text[i], glyph, NK_UTF_SIZE);
if (!byte_len) break;
nk_str_append_text_char(str, glyph, byte_len);
}
return len;
}